

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_8.c
# Opt level: O2

parasail_result_t *
parasail_sw_rowcol_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  longlong *plVar1;
  __m256i alVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  undefined1 auVar7 [32];
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  __m256i c;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  longlong lVar25;
  longlong lVar26;
  uint uVar27;
  parasail_result_t *result;
  __m256i *palVar28;
  __m256i *palVar29;
  __m256i *b;
  long lVar30;
  __m256i *palVar31;
  char *pcVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  char *__format;
  uint uVar36;
  ulong uVar37;
  int iVar38;
  ulong uVar39;
  undefined1 uVar40;
  undefined1 uVar41;
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined8 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 uVar48;
  undefined4 in_stack_fffffffffffffe90;
  char cVar49;
  undefined4 in_stack_fffffffffffffe94;
  __m256i *local_150;
  ulong local_148;
  char local_138;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar32 = "profile";
  }
  else {
    pvVar4 = (profile->profile8).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar32 = "profile->profile8.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar32 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar32 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar32 = "s2";
        }
        else {
          local_148 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar32 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar32 = "open";
          }
          else {
            if (-1 < gap) {
              uVar39 = (ulong)uVar3 + 0x1f >> 5;
              uVar27 = uVar3 - 1;
              uVar36 = (uint)((ulong)uVar27 % uVar39);
              iVar33 = ppVar5->max;
              result = parasail_result_new_rowcol1((uint)((ulong)uVar3 + 0x1f) & 0x7fffffe0,s2Len);
              if (result != (parasail_result_t *)0x0) {
                result->flag = result->flag | 0x20140804;
                palVar28 = parasail_memalign___m256i(0x20,uVar39);
                palVar29 = parasail_memalign___m256i(0x20,uVar39);
                local_150 = parasail_memalign___m256i(0x20,uVar39);
                b = parasail_memalign___m256i(0x20,uVar39);
                if ((b != (__m256i *)0x0 && local_150 != (__m256i *)0x0) &&
                    (palVar29 != (__m256i *)0x0 && palVar28 != (__m256i *)0x0)) {
                  iVar34 = 0;
                  uVar48 = 0;
                  uVar40 = (undefined1)open;
                  uVar41 = (undefined1)gap;
                  alVar2[1]._0_4_ = uVar36;
                  alVar2[0] = in_stack_fffffffffffffe78;
                  alVar2[1]._4_4_ = in_stack_fffffffffffffe84;
                  alVar2[2] = 0;
                  alVar2[3]._0_4_ = in_stack_fffffffffffffe90;
                  alVar2[3]._4_4_ = in_stack_fffffffffffffe94;
                  parasail_memset___m256i(palVar28,alVar2,uVar39);
                  c[1]._0_4_ = uVar36;
                  c[0] = in_stack_fffffffffffffe78;
                  c[1]._4_4_ = in_stack_fffffffffffffe84;
                  c[2]._0_4_ = iVar34;
                  c[2]._4_4_ = uVar48;
                  c[3]._0_4_ = in_stack_fffffffffffffe90;
                  c[3]._4_4_ = in_stack_fffffffffffffe94;
                  parasail_memset___m256i(b,c,uVar39);
                  auVar22._8_8_ = 0x8080808080808080;
                  auVar22._0_8_ = 0x8080808080808080;
                  auVar22._16_8_ = 0x8080808080808080;
                  auVar22._24_8_ = 0x8080808080808080;
                  uVar3 = (uint)uVar39;
                  local_138 = (char)iVar33;
                  lVar30 = uVar39 * 0x20;
                  auVar43 = ZEXT3264(CONCAT131(0x80,CONCAT130(0x80,CONCAT129(0x80,CONCAT128(0x80,
                                                  CONCAT127(0x80,CONCAT126(0x80,CONCAT125(0x80,
                                                  CONCAT124(0x80,CONCAT123(0x80,CONCAT122(0x80,
                                                  CONCAT121(0x80,CONCAT120(0x80,CONCAT119(0x80,
                                                  CONCAT118(0x80,CONCAT117(0x80,CONCAT116(0x80,
                                                  CONCAT115(0x80,CONCAT114(0x80,CONCAT113(0x80,
                                                  CONCAT112(0x80,CONCAT111(0x80,CONCAT110(0x80,
                                                  CONCAT19(0x80,CONCAT18(0x80,0x8080808080808080))))
                                                  )))))))))))))))))))));
                  cVar49 = -0x80;
                  uVar37 = 0;
                  auVar42 = ZEXT3264(auVar22);
                  auVar24[1] = uVar40;
                  auVar24[0] = uVar40;
                  auVar24[2] = uVar40;
                  auVar24[3] = uVar40;
                  auVar24[4] = uVar40;
                  auVar24[5] = uVar40;
                  auVar24[6] = uVar40;
                  auVar24[7] = uVar40;
                  auVar24[8] = uVar40;
                  auVar24[9] = uVar40;
                  auVar24[10] = uVar40;
                  auVar24[0xb] = uVar40;
                  auVar24[0xc] = uVar40;
                  auVar24[0xd] = uVar40;
                  auVar24[0xe] = uVar40;
                  auVar24[0xf] = uVar40;
                  auVar24[0x10] = uVar40;
                  auVar24[0x11] = uVar40;
                  auVar24[0x12] = uVar40;
                  auVar24[0x13] = uVar40;
                  auVar24[0x14] = uVar40;
                  auVar24[0x15] = uVar40;
                  auVar24[0x16] = uVar40;
                  auVar24[0x17] = uVar40;
                  auVar24[0x18] = uVar40;
                  auVar24[0x19] = uVar40;
                  auVar24[0x1a] = uVar40;
                  auVar24[0x1b] = uVar40;
                  auVar24[0x1c] = uVar40;
                  auVar24[0x1d] = uVar40;
                  auVar24[0x1e] = uVar40;
                  auVar24[0x1f] = uVar40;
                  auVar23[1] = uVar41;
                  auVar23[0] = uVar41;
                  auVar23[2] = uVar41;
                  auVar23[3] = uVar41;
                  auVar23[4] = uVar41;
                  auVar23[5] = uVar41;
                  auVar23[6] = uVar41;
                  auVar23[7] = uVar41;
                  auVar23[8] = uVar41;
                  auVar23[9] = uVar41;
                  auVar23[10] = uVar41;
                  auVar23[0xb] = uVar41;
                  auVar23[0xc] = uVar41;
                  auVar23[0xd] = uVar41;
                  auVar23[0xe] = uVar41;
                  auVar23[0xf] = uVar41;
                  auVar23[0x10] = uVar41;
                  auVar23[0x11] = uVar41;
                  auVar23[0x12] = uVar41;
                  auVar23[0x13] = uVar41;
                  auVar23[0x14] = uVar41;
                  auVar23[0x15] = uVar41;
                  auVar23[0x16] = uVar41;
                  auVar23[0x17] = uVar41;
                  auVar23[0x18] = uVar41;
                  auVar23[0x19] = uVar41;
                  auVar23[0x1a] = uVar41;
                  auVar23[0x1b] = uVar41;
                  auVar23[0x1c] = uVar41;
                  auVar23[0x1d] = uVar41;
                  auVar23[0x1e] = uVar41;
                  auVar23[0x1f] = uVar41;
                  do {
                    if (uVar37 == local_148) {
LAB_007c32a9:
                      for (uVar37 = 0; uVar3 * 4 != uVar37; uVar37 = uVar37 + 4) {
                        piVar6 = ((result->field_4).rowcols)->score_col;
                        plVar1 = *palVar28 + uVar37;
                        lVar25 = *plVar1;
                        cVar8 = *(char *)((long)plVar1 + 1);
                        cVar9 = *(char *)((long)plVar1 + 2);
                        cVar10 = *(char *)((long)plVar1 + 3);
                        cVar11 = *(char *)((long)plVar1 + 4);
                        cVar12 = *(char *)((long)plVar1 + 5);
                        cVar13 = *(char *)((long)plVar1 + 6);
                        cVar14 = *(char *)((long)plVar1 + 7);
                        plVar1 = *palVar28 + uVar37 + 2;
                        lVar26 = *plVar1;
                        cVar15 = *(char *)((long)plVar1 + 1);
                        cVar16 = *(char *)((long)plVar1 + 2);
                        cVar17 = *(char *)((long)plVar1 + 3);
                        cVar18 = *(char *)((long)plVar1 + 4);
                        cVar19 = *(char *)((long)plVar1 + 5);
                        cVar20 = *(char *)((long)plVar1 + 6);
                        cVar21 = *(char *)((long)plVar1 + 7);
                        *(int *)((long)piVar6 + uVar37) = (char)lVar25 + 0x80;
                        *(int *)((long)piVar6 + uVar3 * 4 + uVar37) = cVar8 + 0x80;
                        *(int *)((long)piVar6 + uVar3 * 8 + uVar37) = cVar9 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0xc + uVar37) = cVar10 + 0x80;
                        *(int *)((long)piVar6 + (uVar3 << 4) + uVar37) = cVar11 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x14 + uVar37) = cVar12 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x18 + uVar37) = cVar13 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x1c + uVar37) = cVar14 + 0x80;
                        *(int *)((long)piVar6 + lVar30 + uVar37) = (char)lVar25 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x24 + uVar37) = cVar8 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x28 + uVar37) = cVar9 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x2c + uVar37) = cVar10 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x30 + uVar37) = cVar11 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x34 + uVar37) = cVar12 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x38 + uVar37) = cVar13 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x3c + uVar37) = cVar14 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x40 + uVar37) = (char)lVar26 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x44 + uVar37) = cVar15 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x48 + uVar37) = cVar16 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x4c + uVar37) = cVar17 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x50 + uVar37) = cVar18 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x54 + uVar37) = cVar19 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x58 + uVar37) = cVar20 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x5c + uVar37) = cVar21 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x60 + uVar37) = (char)lVar26 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 100 + uVar37) = cVar15 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x68 + uVar37) = cVar16 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x6c + uVar37) = cVar17 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x70 + uVar37) = cVar18 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x74 + uVar37) = cVar19 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x78 + uVar37) = cVar20 + 0x80;
                        *(int *)((long)piVar6 + uVar39 * 0x7c + uVar37) = cVar21 + 0x80;
                      }
                      if (cVar49 == '\x7f') {
                        *(byte *)&result->flag = (byte)result->flag | 0x40;
                      }
                      iVar33 = parasail_result_is_saturated(result);
                      palVar31 = local_150;
                      if (iVar33 == 0) {
                        iVar38 = (int)local_148 + -1;
                        iVar33 = (int)local_148 + -2;
                        if (iVar34 == iVar33) {
                          palVar31 = palVar29;
                        }
                        if (iVar34 == iVar38) {
                          palVar31 = palVar28;
                          palVar28 = local_150;
                        }
                        for (uVar39 = 0; (uVar3 & 0x3ffffff) << 5 != (uint)uVar39;
                            uVar39 = uVar39 + 1) {
                          if ((*(char *)((long)*palVar31 + uVar39) == cVar49) &&
                             (uVar36 = ((uint)uVar39 & 0x1f) * uVar3 +
                                       ((uint)(uVar39 >> 5) & 0x7ffffff), (int)uVar36 < (int)uVar27)
                             ) {
                            uVar27 = uVar36;
                          }
                        }
                        if (iVar34 != iVar33) {
                          local_150 = palVar29;
                        }
                        if (iVar34 != iVar38) {
                          palVar29 = local_150;
                        }
                        iVar33 = cVar49 + 0x80;
                      }
                      else {
                        iVar34 = 0;
                        iVar33 = 0xff;
                        uVar27 = 0;
                      }
                      result->score = iVar33;
                      result->end_query = uVar27;
                      result->end_ref = iVar34;
                      parasail_free(b);
                      parasail_free(palVar31);
                      parasail_free(palVar29);
                      parasail_free(palVar28);
                      return result;
                    }
                    auVar44 = SUB3216(palVar28[uVar3 - 1],0);
                    auVar46._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar42._0_16_;
                    auVar46._16_16_ = ZEXT116(0) * auVar42._16_16_ + ZEXT116(1) * auVar44;
                    auVar46 = vpalignr_avx2((undefined1  [32])palVar28[uVar3 - 1],auVar46,0xf);
                    auVar44 = vpinsrb_avx(auVar46._0_16_,0x80,0);
                    auVar46 = vpblendd_avx2(auVar46,ZEXT1632(auVar44),0xf);
                    iVar33 = ppVar5->mapper[(byte)s2[uVar37]];
                    iVar38 = (int)uVar37 + -2;
                    palVar31 = palVar29;
                    if (iVar34 == iVar38) {
                      palVar31 = local_150;
                    }
                    auVar45 = auVar22;
                    for (lVar35 = 0; lVar30 != lVar35; lVar35 = lVar35 + 0x20) {
                      auVar47 = vpaddsb_avx2(auVar46,*(undefined1 (*) [32])
                                                      ((long)pvVar4 +
                                                      lVar35 + (long)(int)(iVar33 * uVar3) * 0x20));
                      auVar46 = *(undefined1 (*) [32])((long)*b + lVar35);
                      auVar7 = vpmaxsb_avx2(auVar46,auVar45);
                      auVar47 = vpmaxsb_avx2(auVar47,auVar7);
                      *(undefined1 (*) [32])((long)*palVar31 + lVar35) = auVar47;
                      auVar7 = vpmaxsb_avx2(auVar47,auVar42._0_32_);
                      auVar42 = ZEXT3264(auVar7);
                      auVar47 = vpsubsb_avx2(auVar47,auVar24);
                      auVar46 = vpsubsb_avx2(auVar46,auVar23);
                      auVar46 = vpmaxsb_avx2(auVar46,auVar47);
                      *(undefined1 (*) [32])((long)*b + lVar35) = auVar46;
                      auVar46 = vpsubsb_avx2(auVar45,auVar23);
                      auVar45 = vpmaxsb_avx2(auVar46,auVar47);
                      auVar46 = *(undefined1 (*) [32])((long)*palVar28 + lVar35);
                    }
                    if (iVar34 == iVar38) {
                      local_150 = palVar29;
                    }
                    for (iVar33 = 0; iVar33 != 0x20; iVar33 = iVar33 + 1) {
                      auVar47._0_16_ = ZEXT116(0) * auVar45._0_16_ + ZEXT116(1) * auVar42._0_16_;
                      auVar47._16_16_ = ZEXT116(0) * auVar42._16_16_ + ZEXT116(1) * auVar45._0_16_;
                      auVar46 = vpalignr_avx2(auVar45,auVar47,0xf);
                      auVar44 = vpinsrb_avx(auVar46._0_16_,0x80,0);
                      auVar45 = vpblendd_avx2(auVar46,ZEXT1632(auVar44),0xf);
                      lVar35 = 0;
                      while (lVar30 + 0x20 != lVar35 + 0x20) {
                        auVar46 = vpmaxsb_avx2(auVar45,*(undefined1 (*) [32])
                                                        ((long)*palVar31 + lVar35));
                        *(undefined1 (*) [32])((long)*palVar31 + lVar35) = auVar46;
                        auVar47 = vpmaxsb_avx2(auVar46,auVar42._0_32_);
                        auVar42 = ZEXT3264(auVar47);
                        auVar46 = vpsubsb_avx2(auVar46,auVar24);
                        auVar45 = vpsubsb_avx2(auVar45,auVar23);
                        auVar46 = vpcmpgtb_avx2(auVar45,auVar46);
                        lVar35 = lVar35 + 0x20;
                        if ((((((((((((((((((((((((((((((((auVar46 >> 7 & (undefined1  [32])0x1) ==
                                                          (undefined1  [32])0x0 &&
                                                         (auVar46 >> 0xf & (undefined1  [32])0x1) ==
                                                         (undefined1  [32])0x0) &&
                                                        (auVar46 >> 0x17 & (undefined1  [32])0x1) ==
                                                        (undefined1  [32])0x0) &&
                                                       (auVar46 >> 0x1f & (undefined1  [32])0x1) ==
                                                       (undefined1  [32])0x0) &&
                                                      (auVar46 >> 0x27 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0) &&
                                                     (auVar46 >> 0x2f & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar46 >> 0x37 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar46 >> 0x3f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar46 >> 0x47 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar46 >> 0x4f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar46 >> 0x57 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar46 >> 0x5f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar46 >> 0x67 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar46 >> 0x6f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar46 >> 0x77 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar46 >> 0x7f,0) == '\0') &&
                                          (auVar46 >> 0x87 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar46 >> 0x8f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar46 >> 0x97 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar46 >> 0x9f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar46 >> 0xa7 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar46 >> 0xaf & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar46 >> 0xb7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar46 >> 0xbf,0) == '\0') &&
                                  (auVar46 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                                 && (auVar46 >> 0xcf & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar46 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar46 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar46 >> 0xe7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar46 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar46 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            -1 < auVar46[0x1f]) goto LAB_007c31d3;
                      }
                    }
LAB_007c31d3:
                    alVar2 = palVar31[uVar36];
                    for (iVar33 = 0; iVar33 < 0x1f - (int)(uVar27 / uVar39); iVar33 = iVar33 + 1) {
                      auVar46 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,
                                                0x28);
                      alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar46,0xf);
                    }
                    ((result->field_4).rowcols)->score_row[uVar37] = alVar2[2]._7_1_ + 0x80;
                    auVar45 = auVar42._0_32_;
                    auVar46 = vpcmpgtb_avx2(auVar45,auVar43._0_32_);
                    palVar29 = palVar28;
                    palVar28 = palVar31;
                    if ((((((((((((((((((((((((((((((((auVar46 >> 7 & (undefined1  [32])0x1) !=
                                                      (undefined1  [32])0x0 ||
                                                     (auVar46 >> 0xf & (undefined1  [32])0x1) !=
                                                     (undefined1  [32])0x0) ||
                                                    (auVar46 >> 0x17 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0) ||
                                                   (auVar46 >> 0x1f & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar46 >> 0x27 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar46 >> 0x2f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar46 >> 0x37 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar46 >> 0x3f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar46 >> 0x47 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar46 >> 0x4f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar46 >> 0x57 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar46 >> 0x5f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar46 >> 0x67 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar46 >> 0x6f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar46 >> 0x77 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar46 >> 0x7f,0) != '\0')
                                      || (auVar46 >> 0x87 & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                     (auVar46 >> 0x8f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar46 >> 0x97 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar46 >> 0x9f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar46 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar46 >> 0xaf & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar46 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar46 >> 0xbf,0) != '\0') ||
                              (auVar46 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar46 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar46 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar46 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar46 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar46 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar46 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        auVar46[0x1f] < '\0') {
                      auVar46 = vpermq_avx2(auVar45,0x44);
                      auVar46 = vpmaxsb_avx2(auVar45,auVar46);
                      auVar45 = vpslldq_avx2(auVar46,8);
                      auVar46 = vpmaxsb_avx2(auVar46,auVar45);
                      auVar45 = vpslldq_avx2(auVar46,4);
                      auVar46 = vpmaxsb_avx2(auVar46,auVar45);
                      auVar45 = vpslldq_avx2(auVar46,2);
                      auVar46 = vpmaxsb_avx2(auVar46,auVar45);
                      auVar45 = vpslldq_avx2(auVar46,1);
                      auVar46 = vpmaxsb_avx2(auVar46,auVar45);
                      cVar49 = auVar46[0x17];
                      if ((char)('~' - local_138) < cVar49) {
                        *(byte *)&result->flag = (byte)result->flag | 0x40;
                        local_148 = uVar37;
                        goto LAB_007c32a9;
                      }
                      auVar45[8] = 0xf;
                      auVar45._0_8_ = 0xf0f0f0f0f0f0f0f;
                      auVar45[9] = 0xf;
                      auVar45[10] = 0xf;
                      auVar45[0xb] = 0xf;
                      auVar45[0xc] = 0xf;
                      auVar45[0xd] = 0xf;
                      auVar45[0xe] = 0xf;
                      auVar45[0xf] = 0xf;
                      auVar45[0x10] = 0xf;
                      auVar45[0x11] = 0xf;
                      auVar45[0x12] = 0xf;
                      auVar45[0x13] = 0xf;
                      auVar45[0x14] = 0xf;
                      auVar45[0x15] = 0xf;
                      auVar45[0x16] = 0xf;
                      auVar45[0x17] = 0xf;
                      auVar45[0x18] = 0xf;
                      auVar45[0x19] = 0xf;
                      auVar45[0x1a] = 0xf;
                      auVar45[0x1b] = 0xf;
                      auVar45[0x1c] = 0xf;
                      auVar45[0x1d] = 0xf;
                      auVar45[0x1e] = 0xf;
                      auVar45[0x1f] = 0xf;
                      auVar46 = vpshufb_avx2(auVar46,auVar45);
                      auVar46 = vpermq_avx2(auVar46,0xaa);
                      auVar43 = ZEXT3264(auVar46);
                      iVar34 = (int)uVar37;
                    }
                    uVar37 = uVar37 + 1;
                  } while( true );
                }
              }
              return (parasail_result_t *)0x0;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar32 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_rowcol_striped_profile_avx2_256_8",pcVar32);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    int8_t bias = 0;
    int8_t score = 0;
    __m256i vBias;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int8_t maxp = 0;
    __m256i insert_mask;
    /*int8_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    vZero = _mm256_set1_epi8(0);
    bias = INT8_MIN;
    score = bias;
    vBias = _mm256_set1_epi8(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT8_MAX - (int8_t)(matrix->max+1);
    insert_mask = _mm256_cmpgt_epi8(
            _mm256_set_epi8(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT8_MAX : (int8_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 1 bytes */
        vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi8(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi8(vH, vMaxH);
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi8(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi8_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi8(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT8_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT8_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int8_t *t = (int8_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}